

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::Centring(IPM *this,Step *step,double mu)

{
  bool bVar1;
  double *pdVar2;
  Vector *pVVar3;
  valarray<double> *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  Int j_1;
  Int j;
  double sigma;
  Vector su;
  Vector sl;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  Model *model;
  double *in_stack_00000288;
  double *in_stack_00000290;
  double *in_stack_00000298;
  double *in_stack_000002a0;
  double *in_stack_000002a8;
  IPM *in_stack_000002b0;
  double *in_stack_000002c0;
  Step *in_stack_000002c8;
  size_t in_stack_fffffffffffffe98;
  Iterate *in_stack_fffffffffffffea0;
  int local_88;
  int local_84;
  valarray<double> local_68;
  valarray<double> local_58;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Int local_28;
  Int local_24;
  Model *local_20;
  double local_18;
  valarray<double> *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_20 = Iterate::model(*(Iterate **)(in_RDI + 0x10));
  local_24 = Model::rows(local_20);
  local_28 = Model::cols(local_20);
  local_30 = Iterate::xl(*(Iterate **)(in_RDI + 0x10));
  local_38 = Iterate::xu(*(Iterate **)(in_RDI + 0x10));
  local_40 = Iterate::zl(*(Iterate **)(in_RDI + 0x10));
  local_48 = Iterate::zu(*(Iterate **)(in_RDI + 0x10));
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  for (local_84 = 0; local_84 < local_28 + local_24; local_84 = local_84 + 1) {
    bVar1 = Iterate::has_barrier_lb
                      (in_stack_fffffffffffffea0,(Int)(in_stack_fffffffffffffe98 >> 0x20));
    if (bVar1) {
      pdVar2 = std::valarray<double>::operator[](local_30,(long)local_84);
      dVar4 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](local_40,(long)local_84);
      dVar4 = -dVar4 * *pdVar2 + local_18;
      pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_84);
      *pdVar2 = dVar4;
    }
    else {
      pdVar2 = std::valarray<double>::operator[](&local_58,(long)local_84);
      *pdVar2 = 0.0;
    }
  }
  for (local_88 = 0; local_88 < local_28 + local_24; local_88 = local_88 + 1) {
    bVar1 = Iterate::has_barrier_ub
                      (in_stack_fffffffffffffea0,(Int)(in_stack_fffffffffffffe98 >> 0x20));
    if (bVar1) {
      pdVar2 = std::valarray<double>::operator[](local_38,(long)local_88);
      dVar4 = *pdVar2;
      pdVar2 = std::valarray<double>::operator[](local_48,(long)local_88);
      dVar4 = -dVar4 * *pdVar2 + local_18;
      pdVar2 = std::valarray<double>::operator[](&local_68,(long)local_88);
      *pdVar2 = dVar4;
    }
    else {
      pdVar2 = std::valarray<double>::operator[](&local_68,(long)local_88);
      *pdVar2 = 0.0;
    }
  }
  pVVar3 = Iterate::rb(in_stack_fffffffffffffea0);
  std::valarray<double>::operator[](pVVar3,0);
  pVVar3 = Iterate::rc(in_stack_fffffffffffffea0);
  std::valarray<double>::operator[](pVVar3,0);
  pVVar3 = Iterate::rl(in_stack_fffffffffffffea0);
  std::valarray<double>::operator[](pVVar3,0);
  pVVar3 = Iterate::ru(in_stack_fffffffffffffea0);
  std::valarray<double>::operator[](pVVar3,0);
  std::valarray<double>::operator[](&local_58,0);
  std::valarray<double>::operator[](&local_68,0);
  SolveNewtonSystem(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                    in_stack_00000290,in_stack_00000288,in_stack_000002c0,in_stack_000002c8);
  std::valarray<double>::~valarray(local_10);
  std::valarray<double>::~valarray(local_10);
  return;
}

Assistant:

void IPM::Centring(Step& step, double mu) {
  const Model& model = iterate_->model();
  const Int m = model.rows();
  const Int n = model.cols();
  const Vector& xl = iterate_->xl();
  const Vector& xu = iterate_->xu();
  const Vector& zl = iterate_->zl();
  const Vector& zu = iterate_->zu();

  Vector sl(n + m);
  Vector su(n + m);

  // Set sigma to 1 for pure centring
  const double sigma = 1.0;

  // sl = -xl.*zl + sigma*mu
  for (Int j = 0; j < n + m; j++) {
    if (iterate_->has_barrier_lb(j)) {
      sl[j] = -xl[j] * zl[j] + sigma * mu;
    } else {
      sl[j] = 0.0;
    }
  }
  assert(AllFinite(sl));

  // su = -xu.*zu + sigma*mu
  for (Int j = 0; j < n + m; j++) {
    if (iterate_->has_barrier_ub(j)) {
      su[j] = -xu[j] * zu[j] + sigma * mu;
    } else {
      su[j] = 0.0;
    }
  }
  assert(AllFinite(su));

  SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0], &iterate_->rl()[0],
                    &iterate_->ru()[0], &sl[0], &su[0], step);
}